

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::VertexTextureTests::init(VertexTextureTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  TestCaseGroup *pTVar2;
  TestCaseGroup *pTVar3;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  TestCaseGroup *this_02;
  anon_struct_16_2_3f8b7511 *extraout_RAX;
  Vertex2DTextureCase *pVVar4;
  long lVar5;
  anon_struct_16_2_3f8b7511 *paVar6;
  VertexCubeTextureCase *pVVar7;
  Vertex2DArrayTextureCase *pVVar8;
  Vertex3DTextureCase *pVVar9;
  long lVar10;
  allocator<char> local_161;
  long local_160;
  anon_struct_16_2_3f8b7511 *local_158;
  anon_struct_16_2_3f8b7511 *local_150;
  TestCaseGroup *local_148;
  TestCaseGroup *local_140;
  VertexTextureTests *local_138;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  TestCaseGroup *local_f0;
  TestCaseGroup *local_e8;
  TestCaseGroup *local_e0;
  long local_d8;
  TestCaseGroup *local_d0;
  TestCaseGroup *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long local_40;
  TestCaseGroup *local_38;
  
  pTVar2 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar2,(this->super_TestCaseGroup).m_context,"2d","2D Vertex Texture Tests");
  pTVar3 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar3,(this->super_TestCaseGroup).m_context,"cube","Cube Map Vertex Texture Tests");
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"2d_array",
             "2D Array Vertex Texture Tests");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"3d","3D Vertex Texture Tests");
  local_148 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_148,(this->super_TestCaseGroup).m_context,"filtering",
             "2D Vertex Texture Filtering Tests");
  local_e0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_e0,(this->super_TestCaseGroup).m_context,"wrap","2D Vertex Texture Wrap Tests");
  local_140 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_140,(this->super_TestCaseGroup).m_context,"filtering",
             "Cube Map Vertex Texture Filtering Tests");
  local_e8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_e8,(this->super_TestCaseGroup).m_context,"wrap",
             "Cube Map Vertex Texture Wrap Tests");
  local_c8 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_c8,(this->super_TestCaseGroup).m_context,"filtering",
             "2D Array Vertex Texture Filtering Tests");
  local_f0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_f0,(this->super_TestCaseGroup).m_context,"wrap",
             "2D Array Vertex Texture Wrap Tests");
  local_d0 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (local_d0,(this->super_TestCaseGroup).m_context,"filtering",
             "3D Vertex Texture Filtering Tests");
  this_02 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_02,(this->super_TestCaseGroup).m_context,"wrap","3D Vertex Texture Wrap Tests");
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)local_148);
  tcu::TestNode::addChild((TestNode *)pTVar2,(TestNode *)local_e0);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)local_140);
  tcu::TestNode::addChild((TestNode *)pTVar3,(TestNode *)local_e8);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)local_c8);
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)local_f0);
  tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)local_d0);
  local_38 = this_02;
  tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this_02);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar2);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  local_138 = this;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  lVar10 = 0;
  paVar6 = extraout_RAX;
  while (lVar10 != 6) {
    local_158 = init::minFilterModes + lVar10;
    lVar5 = 0;
    local_40 = lVar10;
    while (lVar5 != 2) {
      local_150 = init::magFilterModes + lVar5;
      local_160 = 8;
      local_d8 = lVar5;
      while( true ) {
        if (local_160 == 0x38) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,glcts::fixed_sample_locations_values + 1,&local_161);
        std::operator+(&local_80,&local_60,local_158->name);
        std::operator+(&local_110,&local_80,"_");
        std::operator+(&local_c0,&local_110,local_150->name);
        std::operator+(&local_a0,&local_c0,"_");
        std::operator+(&name,&local_a0,*(char **)(&UNK_01e2b138 + local_160));
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        pVVar4 = (Vertex2DTextureCase *)operator_new(0xa0);
        lVar10 = local_160;
        dVar1 = *(deUint32 *)((long)&init::wrapModes[0].name + local_160);
        Vertex2DTextureCase::Vertex2DTextureCase
                  (pVVar4,(local_138->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,local_158->mode,local_150->mode,dVar1,
                   dVar1);
        tcu::TestNode::addChild((TestNode *)local_148,(TestNode *)pVVar4);
        std::__cxx11::string::~string((string *)&name);
        local_160 = lVar10 + 0x10;
      }
      lVar5 = local_d8 + 1;
    }
    paVar6 = (anon_struct_16_2_3f8b7511 *)0x2;
    lVar10 = local_40 + 1;
  }
  lVar10 = 0;
  while (lVar10 != 3) {
    paVar6 = init::wrapModes;
    local_160 = lVar10;
    for (lVar5 = 8; lVar5 != 0x38; lVar5 = lVar5 + 0x10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_80);
      std::operator+(&local_c0,&local_110,init::wrapModes[lVar10].name);
      std::operator+(&local_a0,&local_c0,"_");
      std::operator+(&name,&local_a0,*(char **)(&UNK_01e2b138 + lVar5));
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_110);
      pVVar4 = (Vertex2DTextureCase *)operator_new(0xa0);
      Vertex2DTextureCase::Vertex2DTextureCase
                (pVVar4,(local_138->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,0x2703,0x2601,init::wrapModes[lVar10].mode
                 ,*(deUint32 *)((long)&init::wrapModes[0].name + lVar5));
      tcu::TestNode::addChild((TestNode *)local_e0,(TestNode *)pVVar4);
      paVar6 = (anon_struct_16_2_3f8b7511 *)std::__cxx11::string::~string((string *)&name);
    }
    lVar10 = local_160 + 1;
  }
  lVar10 = 0;
  while (lVar10 != 6) {
    local_158 = init::minFilterModes + lVar10;
    pTVar2 = (TestCaseGroup *)0x0;
    local_d8 = lVar10;
    while (pTVar2 != (TestCaseGroup *)0x2) {
      local_150 = init::magFilterModes + (long)pTVar2;
      local_160 = 8;
      local_148 = pTVar2;
      while( true ) {
        if (local_160 == 0x38) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,glcts::fixed_sample_locations_values + 1,&local_161);
        std::operator+(&local_80,&local_60,local_158->name);
        std::operator+(&local_110,&local_80,"_");
        std::operator+(&local_c0,&local_110,local_150->name);
        std::operator+(&local_a0,&local_c0,"_");
        std::operator+(&name,&local_a0,*(char **)(&UNK_01e2b138 + local_160));
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        pVVar7 = (VertexCubeTextureCase *)operator_new(0xa0);
        lVar10 = local_160;
        dVar1 = *(deUint32 *)((long)&init::wrapModes[0].name + local_160);
        VertexCubeTextureCase::VertexCubeTextureCase
                  (pVVar7,(local_138->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,local_158->mode,local_150->mode,dVar1,
                   dVar1);
        tcu::TestNode::addChild((TestNode *)local_140,(TestNode *)pVVar7);
        std::__cxx11::string::~string((string *)&name);
        local_160 = lVar10 + 0x10;
      }
      pTVar2 = (TestCaseGroup *)
               ((long)&(local_148->super_TestCaseGroup).super_TestNode._vptr_TestNode + 1);
    }
    paVar6 = (anon_struct_16_2_3f8b7511 *)0x2;
    lVar10 = local_d8 + 1;
  }
  lVar10 = 0;
  while (lVar10 != 3) {
    paVar6 = init::wrapModes;
    local_160 = lVar10;
    for (lVar5 = 8; lVar5 != 0x38; lVar5 = lVar5 + 0x10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_80);
      std::operator+(&local_c0,&local_110,init::wrapModes[lVar10].name);
      std::operator+(&local_a0,&local_c0,"_");
      std::operator+(&name,&local_a0,*(char **)(&UNK_01e2b138 + lVar5));
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_110);
      pVVar7 = (VertexCubeTextureCase *)operator_new(0xa0);
      VertexCubeTextureCase::VertexCubeTextureCase
                (pVVar7,(local_138->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,0x2703,0x2601,init::wrapModes[lVar10].mode
                 ,*(deUint32 *)((long)&init::wrapModes[0].name + lVar5));
      tcu::TestNode::addChild((TestNode *)local_e8,(TestNode *)pVVar7);
      paVar6 = (anon_struct_16_2_3f8b7511 *)std::__cxx11::string::~string((string *)&name);
    }
    lVar10 = local_160 + 1;
  }
  pTVar2 = (TestCaseGroup *)0x0;
  while (pTVar2 != (TestCaseGroup *)0x6) {
    local_158 = init::minFilterModes + (long)pTVar2;
    pTVar3 = (TestCaseGroup *)0x0;
    local_140 = pTVar2;
    while (pTVar3 != (TestCaseGroup *)0x2) {
      local_150 = init::magFilterModes + (long)pTVar3;
      local_160 = 8;
      local_148 = pTVar3;
      while( true ) {
        if (local_160 == 0x38) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,glcts::fixed_sample_locations_values + 1,&local_161);
        std::operator+(&local_80,&local_60,local_158->name);
        std::operator+(&local_110,&local_80,"_");
        std::operator+(&local_c0,&local_110,local_150->name);
        std::operator+(&local_a0,&local_c0,"_");
        std::operator+(&name,&local_a0,*(char **)(&UNK_01e2b138 + local_160));
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        pVVar8 = (Vertex2DArrayTextureCase *)operator_new(0xa0);
        lVar10 = local_160;
        dVar1 = *(deUint32 *)((long)&init::wrapModes[0].name + local_160);
        Vertex2DArrayTextureCase::Vertex2DArrayTextureCase
                  (pVVar8,(local_138->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,local_158->mode,local_150->mode,dVar1,
                   dVar1);
        tcu::TestNode::addChild((TestNode *)local_c8,(TestNode *)pVVar8);
        std::__cxx11::string::~string((string *)&name);
        local_160 = lVar10 + 0x10;
      }
      pTVar3 = (TestCaseGroup *)
               ((long)&(local_148->super_TestCaseGroup).super_TestNode._vptr_TestNode + 1);
    }
    paVar6 = (anon_struct_16_2_3f8b7511 *)0x2;
    pTVar2 = (TestCaseGroup *)
             ((long)&(local_140->super_TestCaseGroup).super_TestNode._vptr_TestNode + 1);
  }
  lVar10 = 0;
  while (lVar10 != 3) {
    paVar6 = init::wrapModes;
    local_160 = lVar10;
    for (lVar5 = 8; lVar5 != 0x38; lVar5 = lVar5 + 0x10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_80);
      std::operator+(&local_c0,&local_110,init::wrapModes[lVar10].name);
      std::operator+(&local_a0,&local_c0,"_");
      std::operator+(&name,&local_a0,*(char **)(&UNK_01e2b138 + lVar5));
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_110);
      pVVar8 = (Vertex2DArrayTextureCase *)operator_new(0xa0);
      Vertex2DArrayTextureCase::Vertex2DArrayTextureCase
                (pVVar8,(local_138->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 glcts::fixed_sample_locations_values + 1,0x2703,0x2601,init::wrapModes[lVar10].mode
                 ,*(deUint32 *)((long)&init::wrapModes[0].name + lVar5));
      tcu::TestNode::addChild((TestNode *)local_f0,(TestNode *)pVVar8);
      paVar6 = (anon_struct_16_2_3f8b7511 *)std::__cxx11::string::~string((string *)&name);
    }
    lVar10 = local_160 + 1;
  }
  for (local_140 = (TestCaseGroup *)0x0; local_140 != (TestCaseGroup *)0x6;
      local_140 = (TestCaseGroup *)((long)local_140 + 1)) {
    local_158 = init::minFilterModes + (long)local_140;
    for (local_148 = (TestCaseGroup *)0x0; local_148 != (TestCaseGroup *)0x2;
        local_148 = (TestCaseGroup *)((long)local_148 + 1)) {
      local_150 = init::magFilterModes + (long)local_148;
      local_160 = 8;
      while( true ) {
        if (local_160 == 0x38) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,glcts::fixed_sample_locations_values + 1,&local_161);
        std::operator+(&local_80,&local_60,local_158->name);
        std::operator+(&local_110,&local_80,"_");
        std::operator+(&local_c0,&local_110,local_150->name);
        std::operator+(&local_a0,&local_c0,"_");
        std::operator+(&name,&local_a0,*(char **)(&UNK_01e2b138 + local_160));
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        pVVar9 = (Vertex3DTextureCase *)operator_new(0xa8);
        lVar10 = local_160;
        dVar1 = *(deUint32 *)((long)&init::wrapModes[0].name + local_160);
        Vertex3DTextureCase::Vertex3DTextureCase
                  (pVVar9,(local_138->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,local_158->mode,local_150->mode,dVar1,
                   dVar1,dVar1);
        tcu::TestNode::addChild((TestNode *)local_d0,(TestNode *)pVVar9);
        std::__cxx11::string::~string((string *)&name);
        local_160 = lVar10 + 0x10;
      }
    }
    paVar6 = (anon_struct_16_2_3f8b7511 *)0x2;
  }
  for (local_140 = (TestCaseGroup *)0x0; local_140 != (TestCaseGroup *)0x3;
      local_140 = (TestCaseGroup *)((long)local_140 + 1)) {
    local_158 = init::wrapModes + (long)local_140;
    for (local_148 = (TestCaseGroup *)0x0; local_148 != (TestCaseGroup *)0x3;
        local_148 = (TestCaseGroup *)((long)local_148 + 1)) {
      local_150 = init::wrapModes + (long)local_148;
      local_160 = 8;
      while( true ) {
        if (local_160 == 0x38) break;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_60,glcts::fixed_sample_locations_values + 1,&local_161);
        std::operator+(&local_80,&local_60,local_158->name);
        std::operator+(&local_110,&local_80,"_");
        std::operator+(&local_c0,&local_110,local_150->name);
        std::operator+(&local_a0,&local_c0,"_");
        std::operator+(&name,&local_a0,*(char **)(&UNK_01e2b138 + local_160));
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_60);
        pVVar9 = (Vertex3DTextureCase *)operator_new(0xa8);
        lVar10 = local_160;
        Vertex3DTextureCase::Vertex3DTextureCase
                  (pVVar9,(local_138->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                   glcts::fixed_sample_locations_values + 1,0x2703,0x2601,local_158->mode,
                   local_150->mode,*(deUint32 *)((long)&init::wrapModes[0].name + local_160));
        tcu::TestNode::addChild((TestNode *)local_38,(TestNode *)pVVar9);
        std::__cxx11::string::~string((string *)&name);
        local_160 = lVar10 + 0x10;
      }
    }
    paVar6 = (anon_struct_16_2_3f8b7511 *)0x3;
  }
  return (int)paVar6;
}

Assistant:

void VertexTextureTests::init (void)
{
	// 2D and cube map groups, and their filtering and wrap sub-groups.
	TestCaseGroup* const group2D				= new TestCaseGroup(m_context, "2d",			"2D Vertex Texture Tests");
	TestCaseGroup* const groupCube				= new TestCaseGroup(m_context, "cube",			"Cube Map Vertex Texture Tests");
	TestCaseGroup* const group2DArray			= new TestCaseGroup(m_context, "2d_array",		"2D Array Vertex Texture Tests");
	TestCaseGroup* const group3D				= new TestCaseGroup(m_context, "3d",			"3D Vertex Texture Tests");
	TestCaseGroup* const filteringGroup2D		= new TestCaseGroup(m_context, "filtering",		"2D Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup2D			= new TestCaseGroup(m_context, "wrap",			"2D Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroupCube		= new TestCaseGroup(m_context, "filtering",		"Cube Map Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroupCube			= new TestCaseGroup(m_context, "wrap",			"Cube Map Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroup2DArray	= new TestCaseGroup(m_context, "filtering",		"2D Array Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup2DArray		= new TestCaseGroup(m_context, "wrap",			"2D Array Vertex Texture Wrap Tests");
	TestCaseGroup* const filteringGroup3D		= new TestCaseGroup(m_context, "filtering",		"3D Vertex Texture Filtering Tests");
	TestCaseGroup* const wrapGroup3D			= new TestCaseGroup(m_context, "wrap",			"3D Vertex Texture Wrap Tests");

	group2D->addChild(filteringGroup2D);
	group2D->addChild(wrapGroup2D);
	groupCube->addChild(filteringGroupCube);
	groupCube->addChild(wrapGroupCube);
	group2DArray->addChild(filteringGroup2DArray);
	group2DArray->addChild(wrapGroup2DArray);
	group3D->addChild(filteringGroup3D);
	group3D->addChild(wrapGroup3D);

	addChild(group2D);
	addChild(groupCube);
	addChild(group2DArray);
	addChild(group3D);

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE	},
		{ "repeat",		GL_REPEAT			},
		{ "mirror",		GL_MIRRORED_REPEAT	}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		GLenum			mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST	},
		{ "linear",		GL_LINEAR	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup2D->addChild(new Vertex2DTextureCase(m_context,
															   name.c_str(), "",
															   minFilterModes[minFilter].mode,
															   magFilterModes[magFilter].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroup2D->addChild(new Vertex2DTextureCase(m_context,
														  name.c_str(), "",
														  GL_LINEAR_MIPMAP_LINEAR,
														  GL_LINEAR,
														  wrapModes[wrapSMode].mode,
														  wrapModes[wrapTMode].mode));
		}));

	// Cube map cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroupCube->addChild(new VertexCubeTextureCase(m_context,
																   name.c_str(), "",
																   minFilterModes[minFilter].mode,
																   magFilterModes[magFilter].mode,
																   wrapModes[wrapMode].mode,
																   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroupCube->addChild(new VertexCubeTextureCase(m_context,
															  name.c_str(), "",
															  GL_LINEAR_MIPMAP_LINEAR,
															  GL_LINEAR,
															  wrapModes[wrapSMode].mode,
															  wrapModes[wrapTMode].mode));
		}));

	// 2D array cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup2DArray->addChild(new Vertex2DArrayTextureCase(m_context,
																		 name.c_str(), "",
																		 minFilterModes[minFilter].mode,
																		 magFilterModes[magFilter].mode,
																		 wrapModes[wrapMode].mode,
																		 wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name;

			wrapGroup2DArray->addChild(new Vertex2DArrayTextureCase(m_context,
																	name.c_str(), "",
																	GL_LINEAR_MIPMAP_LINEAR,
																	GL_LINEAR,
																	wrapModes[wrapSMode].mode,
																	wrapModes[wrapTMode].mode));
		}));

	// 3D cases.

	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
		{
			const string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name;

			filteringGroup3D->addChild(new Vertex3DTextureCase(m_context,
															   name.c_str(), "",
															   minFilterModes[minFilter].mode,
															   magFilterModes[magFilter].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode,
															   wrapModes[wrapMode].mode));
		})));

	FOR_EACH(wrapSMode,		wrapModes,
	FOR_EACH(wrapTMode,		wrapModes,
	FOR_EACH(wrapRMode,		wrapModes,
		{
			const string name = string("") + wrapModes[wrapSMode].name + "_" + wrapModes[wrapTMode].name + "_" + wrapModes[wrapRMode].name;

			wrapGroup3D->addChild(new Vertex3DTextureCase(m_context,
														  name.c_str(), "",
														  GL_LINEAR_MIPMAP_LINEAR,
														  GL_LINEAR,
														  wrapModes[wrapSMode].mode,
														  wrapModes[wrapTMode].mode,
														  wrapModes[wrapRMode].mode));
		})));
}